

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::
key_value<jsoncons::byte_string_arg_t_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,int>
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,key_type *name,byte_string_arg_t *args,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *args_1,int *args_2)

{
  int iVar1;
  undefined8 in_RCX;
  string *in_RSI;
  string *in_RDI;
  int *in_R8;
  allocator<char> local_2a [2];
  int *local_28;
  undefined8 local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  iVar1 = *local_28;
  std::allocator<char>::allocator();
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  basic_json<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(in_RDI + 0x20),
             local_20,(long)iVar1,local_2a,0);
  std::allocator<char>::~allocator(local_2a);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }